

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O3

void __thiscall
ruckig::InputParameter<0UL,_ruckig::StandardVector>::initialize
          (InputParameter<0UL,_ruckig::StandardVector> *this)

{
  ulong *puVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  _Bit_type *p_Var8;
  ulong uVar9;
  ulong uVar10;
  
  if (this->degrees_of_freedom != 0) {
    pdVar2 = (this->current_velocity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->current_acceleration).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->target_velocity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->target_acceleration).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar6 = (this->max_acceleration).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->max_jerk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var8 = (this->enabled).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar9 = 0;
    do {
      pdVar2[uVar9] = 0.0;
      pdVar3[uVar9] = 0.0;
      pdVar4[uVar9] = 0.0;
      pdVar5[uVar9] = 0.0;
      pdVar6[uVar9] = INFINITY;
      pdVar7[uVar9] = INFINITY;
      uVar10 = uVar9 + 0x3f;
      if (-1 < (long)uVar9) {
        uVar10 = uVar9;
      }
      puVar1 = p_Var8 + ((long)uVar10 >> 6) +
                        (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)uVar9 & 0x3f);
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->degrees_of_freedom);
  }
  return;
}

Assistant:

void initialize() {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            current_velocity[dof] = 0.0;
            current_acceleration[dof] = 0.0;
            target_velocity[dof] = 0.0;
            target_acceleration[dof] = 0.0;
            max_acceleration[dof] = std::numeric_limits<double>::infinity();
            max_jerk[dof] = std::numeric_limits<double>::infinity();
            enabled[dof] = true;
        }
    }